

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

void sg_init_image(sg_image img_id,sg_image_desc *desc)

{
  sg_image_desc desc_def;
  sg_image_desc sStack_6a8;
  
  if (_sg.valid) {
    _sg_image_desc_defaults(&sStack_6a8,desc);
    _sg_init_image(img_id,&sStack_6a8);
    return;
  }
  __assert_fail("_sg.valid",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                ,0x3a50,"void sg_init_image(sg_image, const sg_image_desc *)");
}

Assistant:

inline void sg_init_image(sg_image img_id, const sg_image_desc& desc) { return sg_init_image(img_id, &desc); }